

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exporter.cpp
# Opt level: O3

bool __thiscall FSSExporter::do_export(FSSExporter *this)

{
  ulong uVar1;
  QString *pQVar2;
  int iVar3;
  QArrayData *pQVar4;
  char cVar5;
  Type TVar6;
  Resource resource;
  Resource resource_00;
  Resource resource_01;
  long lVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QSettings meta_file;
  undefined1 local_128 [40];
  FSSExporter *local_100;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  string local_d8;
  undefined1 local_b8 [24];
  char16_t *pcStack_a0;
  size_type local_98;
  QString local_88;
  QString local_68;
  QString local_48;
  
  QDir::QDir((QDir *)local_128,&this->path);
  pQVar4 = *(QArrayData **)&this->dir;
  *(undefined8 *)&this->dir = local_128._0_8_;
  local_128._0_8_ = pQVar4;
  local_100 = this;
  QDir::~QDir((QDir *)local_128);
  cVar5 = QDir::exists();
  if (cVar5 != '\0') {
    operator+((QString *)local_128,&this->path,"/meta.ini");
    QSettings::QSettings((QSettings *)local_b8,(QString *)local_128,IniFormat,(QObject *)0x0);
    if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_128._0_8_ = *(int *)local_128._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_128._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_128._0_8_,2,8);
      }
    }
    QVar8.m_data = (storage_type *)0x5;
    QVar8.m_size = (qsizetype)local_128;
    QString::fromUtf8(QVar8);
    local_f8.shared = (PrivateShared *)local_128._0_8_;
    local_f8._8_8_ = local_128._8_8_;
    local_f8._16_8_ = local_128._16_8_;
    QString::number((int)&local_d8,local_100->scale);
    QVariant::QVariant((QVariant *)local_128,(QString *)&local_d8);
    QSettings::setValue((QString *)local_b8,(QVariant *)local_f8.data);
    QVariant::~QVariant((QVariant *)local_128);
    if ((QArrayData *)local_d8._M_dataplus._M_p != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_d8._M_dataplus._M_p = *(int *)local_d8._M_dataplus._M_p + -1;
      UNLOCK();
      if (*(int *)local_d8._M_dataplus._M_p == 0) {
        QArrayData::deallocate((QArrayData *)local_d8._M_dataplus._M_p,2,8);
      }
    }
    if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
      UNLOCK();
      if (*(int *)local_f8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
      }
    }
    QVar9.m_data = (storage_type *)0x4;
    QVar9.m_size = (qsizetype)local_128;
    QString::fromUtf8(QVar9);
    local_f8.shared = (PrivateShared *)local_128._0_8_;
    local_f8._8_8_ = local_128._8_8_;
    local_f8._16_8_ = local_128._16_8_;
    QVariant::QVariant((QVariant *)local_128,(local_100->name)._M_dataplus._M_p);
    QSettings::setValue((QString *)local_b8,(QVariant *)local_f8.data);
    QVariant::~QVariant((QVariant *)local_128);
    if ((QArrayData *)local_f8.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_f8.shared = *(int *)local_f8.shared + -1;
      UNLOCK();
      if (*(int *)local_f8.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_f8.shared,2,8);
      }
    }
    lVar7 = -0x21;
    do {
      uVar1 = lVar7 + 0x22;
      resource_01 = (Resource)uVar1;
      TVar6 = Data::get_resource_type(resource_01);
      switch(TVar6) {
      case TypeSprite:
        exportResourceSprite(local_100,resource_01);
        break;
      case TypeAnimation:
        exportResourceAnimation(local_100,resource_01);
        break;
      case TypeSound:
        QVar10.m_data = (storage_type *)0x3;
        QVar10.m_size = (qsizetype)local_128;
        QString::fromUtf8(QVar10);
        local_68.d.d = (Data *)local_128._0_8_;
        local_68.d.ptr = (char16_t *)local_128._8_8_;
        local_68.d.size = local_128._16_8_;
        exportResourceData(local_100,resource_01,&local_68);
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar3 = ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar2 = &local_68;
joined_r0x001208fd:
          if (iVar3 == 0) {
            QArrayData::deallocate(&((pQVar2->d).d)->super_QArrayData,2,8);
          }
        }
        break;
      case TypeMusic:
        QVar11.m_data = (storage_type *)0x3;
        QVar11.m_size = (qsizetype)local_128;
        QString::fromUtf8(QVar11);
        local_88.d.d = (Data *)local_128._0_8_;
        local_88.d.ptr = (char16_t *)local_128._8_8_;
        local_88.d.size = local_128._16_8_;
        exportResourceData(local_100,resource_01,&local_88);
        if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar3 = ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          pQVar2 = &local_88;
          goto joined_r0x001208fd;
        }
      }
      QVar12.m_data = (storage_type *)0xa;
      QVar12.m_size = (qsizetype)local_128;
      QString::fromUtf8(QVar12);
      local_b8._16_8_ = local_128._0_8_;
      pcStack_a0 = (char16_t *)local_128._8_8_;
      local_98 = local_128._16_8_;
      Data::get_resource_name_abi_cxx11_((string *)local_128,(Data *)(uVar1 & 0xffffffff),resource);
      operator+(&local_48,(QString *)(local_b8 + 0x10),(char *)local_128._0_8_);
      Data::get_resource_name_abi_cxx11_(&local_d8,(Data *)(uVar1 & 0xffffffff),resource_00);
      QVariant::QVariant((QVariant *)&local_f8,local_d8._M_dataplus._M_p);
      QSettings::setValue((QString *)local_b8,(QVariant *)&local_48);
      QVariant::~QVariant((QVariant *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
        }
      }
      if ((QArrayData *)local_128._0_8_ != (QArrayData *)(local_128 + 0x10)) {
        operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
      }
      if ((QArrayData *)local_b8._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._16_8_,2,8);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
    QSettings::~QSettings((QSettings *)local_b8);
  }
  return (bool)cVar5;
}

Assistant:

bool
FSSExporter::do_export() {
  dir = QDir(path);
  if (!dir.exists()) {
    return false;
  }

  QSettings meta_file(path + "/meta.ini", QSettings::IniFormat);

  meta_file.setValue("scale", QString::number(scale));
  meta_file.setValue("name", name.c_str());

  for (size_t r = Data::AssetArtLandscape; r <= Data::AssetCursor; r++) {
    Data::Resource res = static_cast<Data::Resource>(r);
    switch (Data::get_resource_type(res)) {
      case Data::TypeSprite: {
        exportResourceSprite(res);
        break;
      }
      case Data::TypeAnimation: {
        exportResourceAnimation(res);
        break;
      }
      case Data::TypeSound: {
        exportResourceData(res, "wav");
        break;
      }
      case Data::TypeMusic: {
        exportResourceData(res, "mid");
        break;
      }
      default: {
        break;
      }
    }
    meta_file.setValue(QString("resources/")
                       + Data::get_resource_name(res).c_str(),
                       Data::get_resource_name(res).c_str());
  }

  return true;
}